

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

void __thiscall soul::Value::Value(Value *this,bool v)

{
  PackedData PStack_48;
  Type local_30;
  
  local_30.category = primitive;
  local_30.arrayElementCategory = invalid;
  local_30.isRef = false;
  local_30.isConstant = false;
  local_30.primitiveType.type = bool_;
  local_30.boundingSize = 0;
  local_30.arrayElementBoundingSize = 0;
  local_30.structure.object = (Structure *)0x0;
  Value(this,&local_30);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_30.structure.object);
  getData(&PStack_48,this);
  if (PStack_48.size == 1) {
    *PStack_48.data = v;
    return;
  }
  throwInternalCompilerError("size == sizeof (Primitive)","setAs",0x161);
}

Assistant:

Value::Value (bool     v)  : Value (Type (PrimitiveType::bool_))     { getData().setAs (v ? (uint8_t) 1 : (uint8_t) 0); }